

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

bool __thiscall cmMakefile::PolicyOptionalWarningEnabled(cmMakefile *this,string *var)

{
  cmake *pcVar1;
  bool bVar2;
  undefined1 uVar3;
  char *val;
  
  if (var->_M_string_length != 0) {
    val = GetDefinition(this,var);
    if (val != (char *)0x0) {
      bVar2 = cmSystemTools::IsOn(val);
      return bVar2;
    }
  }
  pcVar1 = this->GlobalGenerator->CMakeInstance;
  uVar3 = 1;
  if (pcVar1->DebugOutput == false) {
    uVar3 = pcVar1->Trace;
  }
  return (bool)uVar3;
}

Assistant:

bool cmMakefile::PolicyOptionalWarningEnabled(std::string const& var)
{
  // Check for an explicit CMAKE_POLICY_WARNING_CMP<NNNN> setting.
  if(!var.empty())
    {
    if(const char* val = this->GetDefinition(var))
      {
      return cmSystemTools::IsOn(val);
      }
    }
  // Enable optional policy warnings with --debug-output, --trace,
  // or --trace-expand.
  cmake* cm = this->GetCMakeInstance();
  return cm->GetDebugOutput() || cm->GetTrace();
}